

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_4::TwoLevelIterator::status(TwoLevelIterator *this)

{
  Iterator *in_RAX;
  _func_int **pp_Var1;
  long in_RSI;
  bool bVar2;
  Iterator *local_38;
  
  local_38 = in_RAX;
  IteratorWrapper::status((IteratorWrapper *)&local_38);
  if (local_38 == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) == 0) {
      bVar2 = false;
    }
    else {
      IteratorWrapper::status((IteratorWrapper *)&local_38);
      bVar2 = local_38 != (Iterator *)0x0;
      if (local_38 != (Iterator *)0x0) {
        operator_delete__(local_38);
      }
    }
    if (!bVar2) {
      if (*(char **)(in_RSI + 0x48) == (char *)0x0) {
        pp_Var1 = (_func_int **)0x0;
      }
      else {
        pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x48));
      }
      (this->super_Iterator)._vptr_Iterator = pp_Var1;
      return (Status)(char *)this;
    }
  }
  else {
    operator_delete__(local_38);
  }
  IteratorWrapper::status((IteratorWrapper *)this);
  return (Status)(char *)this;
}

Assistant:

virtual Status status() const {
                // It'd be nice if status() returned a const Status& instead of a Status
                if (!index_iter_.status().ok()) {
                    return index_iter_.status();
                } else if (data_iter_.iter() != NULL && !data_iter_.status().ok()) {
                    return data_iter_.status();
                } else {
                    return status_;
                }
            }